

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# allreduce.h
# Opt level: O2

void __thiscall node_socks::~node_socks(node_socks *this)

{
  bool bVar1;
  
  bVar1 = std::operator!=(&this->current_master,"");
  if (bVar1) {
    if (this->parent != -1) {
      close(this->parent);
    }
    if (this->children[0] != -1) {
      close(this->children[0]);
    }
    if (this->children[1] != -1) {
      close(this->children[1]);
    }
  }
  std::__cxx11::string::~string((string *)this);
  return;
}

Assistant:

~node_socks()
  {
    if (current_master != "")
    {
      if (parent != -1)
        CLOSESOCK(this->parent);
      if (children[0] != -1)
        CLOSESOCK(this->children[0]);
      if (children[1] != -1)
        CLOSESOCK(this->children[1]);
    }
  }